

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [41],unsigned_long *params_1,
          char (*params_2) [9],char **params_3,char *params_4)

{
  char (*value) [41];
  unsigned_long *value_00;
  char (*value_01) [9];
  char **value_02;
  char *value_03;
  String *__return_storage_ptr___00;
  char local_91 [1];
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_26UL> local_70;
  ArrayPtr<const_char> local_48;
  char **local_38;
  char *params_local_4;
  char **params_local_3;
  char (*params_local_2) [9];
  unsigned_long *params_local_1;
  char (*params_local) [41];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = *params_2;
  params_local_3 = (char **)params_1;
  params_local_2 = (char (*) [9])params;
  params_local_1 = (unsigned_long *)this;
  params_local = (char (*) [41])__return_storage_ptr__;
  value = ::const((char (*) [41])this);
  local_48 = toCharSequence<char_const(&)[41]>(value);
  value_00 = fwd<unsigned_long>((NoInfer<unsigned_long> *)params_local_2);
  toCharSequence<unsigned_long>(&local_70,value_00);
  value_01 = ::const((char (*) [9])params_local_3);
  local_80 = toCharSequence<char_const(&)[9]>(value_01);
  value_02 = fwd<char_const*&>((char **)params_local_4);
  local_90 = toCharSequence<char_const*&>(value_02);
  value_03 = fwd<char>((NoInfer<char> *)local_38);
  local_91[0] = (char)toCharSequence<char>(value_03);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr___00,(_ *)&local_48,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_26UL> *)&local_80,&local_90,(ArrayPtr<const_char> *)local_91,
             (FixedArray<char,_1UL> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}